

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O0

expr_node * __thiscall expr_tree::derivative(expr_tree *this,expr_node *node)

{
  expr_node *peVar1;
  expr_node *peVar2;
  expr_tree *in_RSI;
  expr_tree *in_RDI;
  expr_node *deriv;
  expr_node *in_stack_ffffffffffffff08;
  expr_tree *in_stack_ffffffffffffff10;
  expr_node *in_stack_ffffffffffffff18;
  expr_tree *in_stack_ffffffffffffff20;
  expr_node *in_stack_ffffffffffffff28;
  expr_tree *in_stack_ffffffffffffff30;
  expr_node *in_stack_ffffffffffffff38;
  expr_tree *in_stack_ffffffffffffff40;
  expr_node *in_stack_ffffffffffffff48;
  expr_tree *in_stack_ffffffffffffff50;
  expr_value local_98;
  expr_value local_90;
  expr_value in_stack_ffffffffffffff78;
  expr_value in_stack_ffffffffffffff80;
  expr_value in_stack_ffffffffffffff88;
  expr_value in_stack_ffffffffffffff90;
  expr_value local_68;
  expr_value local_60;
  expr_value local_58;
  expr_value local_50;
  expr_value local_48;
  expr_value local_40;
  expr_value local_38 [3];
  expr_value local_20;
  expr_node *this_00;
  
  this_00 = (expr_node *)0x0;
  if (*(char *)&in_RSI->root_ == '\x05') {
    peVar1 = (expr_node *)((in_RSI->parameters_).DEFAULT_CAPACITY - 1);
    switch(peVar1) {
    case (expr_node *)0x0:
      this_00 = (expr_node *)operator_new(0x28);
      expr_value::expr_value((expr_value *)&local_20,1);
      expr_node::expr_node(this_00,'\x05',&local_20);
      peVar1 = derivative(in_RSI,this_00);
      this_00->left = peVar1;
      peVar1 = derivative(in_RSI,this_00);
      this_00->right = peVar1;
      Link(this_00,this_00->left,this_00->right);
      break;
    case (expr_node *)0x1:
      this_00 = (expr_node *)operator_new(0x28);
      expr_value::expr_value((expr_value *)local_38,2);
      expr_node::expr_node(this_00,'\x05',local_38);
      if ((in_RSI->parameters_).size_ == 0) {
        this_00->left = (expr_node *)0x0;
      }
      else {
        peVar1 = derivative(in_RSI,this_00);
        this_00->left = peVar1;
      }
      peVar1 = derivative(in_RSI,this_00);
      this_00->right = peVar1;
      Link(this_00,this_00->left,this_00->right);
      break;
    case (expr_node *)0x2:
      this_00 = mulDeriv(in_RDI,peVar1);
      break;
    case (expr_node *)0x3:
      this_00 = divDeriv(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      break;
    case (expr_node *)0x4:
      this_00 = (expr_node *)operator_new(0x28);
      expr_value::expr_value((expr_value *)&local_48,3);
      expr_node::expr_node(this_00,'\x05',&local_48);
      peVar1 = derivative(in_RSI,this_00);
      this_00->left = peVar1;
      peVar1 = pwrDeriv(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      this_00->right = peVar1;
      Link(this_00,this_00->left,this_00->right);
      break;
    case (expr_node *)0x5:
      this_00 = expDeriv(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      break;
    case (expr_node *)0x6:
      this_00 = logDeriv(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      break;
    case (expr_node *)0x7:
      this_00 = (expr_node *)operator_new(0x28);
      expr_value::expr_value((expr_value *)&local_40,3);
      expr_node::expr_node(this_00,'\x05',&local_40);
      peVar1 = derivative(in_RSI,this_00);
      this_00->left = peVar1;
      peVar1 = sqrtDeriv(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      this_00->right = peVar1;
      Link(this_00,this_00->left,this_00->right);
      break;
    case (expr_node *)0x8:
      this_00 = (expr_node *)operator_new(0x28);
      expr_value::expr_value((expr_value *)&local_50,3);
      expr_node::expr_node(this_00,'\x05',&local_50);
      peVar1 = derivative(in_RSI,this_00);
      this_00->left = peVar1;
      peVar1 = sinDeriv(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      this_00->right = peVar1;
      Link(this_00,this_00->left,this_00->right);
      break;
    case (expr_node *)0x9:
      this_00 = (expr_node *)operator_new(0x28);
      expr_value::expr_value((expr_value *)&local_58,3);
      expr_node::expr_node(this_00,'\x05',&local_58);
      peVar1 = derivative(in_RSI,this_00);
      this_00->left = peVar1;
      peVar1 = cosDeriv(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      this_00->right = peVar1;
      Link(this_00,this_00->left,this_00->right);
      break;
    case (expr_node *)0xa:
      this_00 = (expr_node *)operator_new(0x28);
      expr_value::expr_value((expr_value *)&local_60,3);
      expr_node::expr_node(this_00,'\x05',&local_60);
      peVar2 = derivative(in_RSI,this_00);
      this_00->left = peVar2;
      peVar1 = tanDeriv(in_RDI,peVar1);
      this_00->right = peVar1;
      Link(this_00,this_00->left,this_00->right);
      break;
    case (expr_node *)0xb:
      peVar1 = (expr_node *)operator_new(0x28);
      expr_value::expr_value((expr_value *)&local_68,3);
      expr_node::expr_node(peVar1,'\x05',&local_68);
      this_00 = peVar1;
      peVar2 = derivative(in_RSI,peVar1);
      this_00->left = peVar2;
      peVar1 = cotDeriv(in_stack_ffffffffffffff20,peVar1);
      this_00->right = peVar1;
      Link(this_00,this_00->left,this_00->right);
      break;
    case (expr_node *)0xc:
      this_00 = (expr_node *)operator_new(0x28);
      expr_value::expr_value((expr_value *)&stack0xffffffffffffff90,3);
      expr_node::expr_node(this_00,'\x05',(expr_value *)&stack0xffffffffffffff90);
      peVar1 = derivative(in_RSI,this_00);
      this_00->left = peVar1;
      peVar1 = arcsinDeriv((expr_tree *)in_stack_ffffffffffffff90,
                           (expr_node *)in_stack_ffffffffffffff88);
      this_00->right = peVar1;
      Link(this_00,this_00->left,this_00->right);
      break;
    case (expr_node *)0xd:
      this_00 = (expr_node *)operator_new(0x28);
      expr_value::expr_value((expr_value *)&stack0xffffffffffffff88,3);
      expr_node::expr_node(this_00,'\x05',(expr_value *)&stack0xffffffffffffff88);
      peVar1 = derivative(in_RSI,this_00);
      this_00->left = peVar1;
      peVar1 = arccosDeriv(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      this_00->right = peVar1;
      Link(this_00,this_00->left,this_00->right);
      break;
    case (expr_node *)0xe:
      this_00 = (expr_node *)operator_new(0x28);
      expr_value::expr_value((expr_value *)&stack0xffffffffffffff80,3);
      expr_node::expr_node(this_00,'\x05',(expr_value *)&stack0xffffffffffffff80);
      peVar1 = derivative(in_RSI,this_00);
      this_00->left = peVar1;
      peVar1 = arctanDeriv((expr_tree *)in_stack_ffffffffffffff80,
                           (expr_node *)in_stack_ffffffffffffff78);
      this_00->right = peVar1;
      Link(this_00,this_00->left,this_00->right);
      break;
    case (expr_node *)0xf:
      this_00 = (expr_node *)operator_new(0x28);
      expr_value::expr_value((expr_value *)&stack0xffffffffffffff78,3);
      expr_node::expr_node(this_00,'\x05',(expr_value *)&stack0xffffffffffffff78);
      peVar1 = derivative(in_RSI,this_00);
      this_00->left = peVar1;
      peVar1 = arccotDeriv(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      this_00->right = peVar1;
      Link(this_00,this_00->left,this_00->right);
    }
  }
  else if (*(char *)&in_RSI->root_ == '\x03') {
    this_00 = (expr_node *)operator_new(0x28);
    expr_value::expr_value((expr_value *)&local_90,1);
    expr_node::expr_node
              (this_00,'\x01',&local_90,(expr_node *)0x0,(expr_node *)0x0,(expr_node *)0x0);
  }
  else {
    this_00 = (expr_node *)operator_new(0x28);
    expr_value::expr_value((expr_value *)&local_98,0);
    expr_node::expr_node
              (this_00,'\x01',&local_98,(expr_node *)0x0,(expr_node *)0x0,(expr_node *)0x0);
  }
  return this_00;
}

Assistant:

expr_node* expr_tree::derivative(const expr_node* node)
{
    expr_node* deriv = nullptr;
    if (node->type == OP) {
        switch (node->value.integer) {
        case ADD:
            deriv = new expr_node(OP, (long)ADD);
            deriv->left = derivative(node->left);
            deriv->right = derivative(node->right);
            Link(deriv, deriv->left, deriv->right);
            break;
        case SUB:
            deriv = new expr_node(OP, (long)SUB);
            if (node->left != nullptr) // bc minus can be unary
                deriv->left = derivative(node->left);
            else
                deriv->left = nullptr;
            deriv->right = derivative(node->right);
            Link(deriv, deriv->left, deriv->right);
            break;
        case MUL:
            deriv = mulDeriv(node);
            break;
        case DIV:
            deriv = divDeriv(node);
            break;
        case SQRT:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->right);
            deriv->right = sqrtDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        case EXP:
            deriv = expDeriv(node);
            break;
        case LOG:
            deriv = logDeriv(node);
            break;
        case PWR:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->left);
            deriv->right = pwrDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        case SIN:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->right);
            deriv->right = sinDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        case COS:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->right);
            deriv->right = cosDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        case TAN:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->right);
            deriv->right = tanDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        case COT:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->right);
            deriv->right = cotDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        case ASIN:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->right);
            deriv->right = arcsinDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        case ACOS:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->right);
            deriv->right = arccosDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        case ATAN:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->right);
            deriv->right = arctanDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        case ACOT:
            deriv = new expr_node(OP, (long)MUL);
            deriv->left = derivative(node->right);
            deriv->right = arccotDeriv(node);
            Link(deriv, deriv->left, deriv->right);
            break;
        default:
            break;
        }
    } else if (node->type == VAR) {
        deriv = new expr_node(INT, (long)1, nullptr, nullptr, nullptr);
    } else {
        deriv = new expr_node(INT, (long)0, nullptr, nullptr, nullptr);
    }
    return deriv;
}